

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O1

fio_str_info_s *
fio_str_resize(fio_str_info_s *__return_storage_ptr__,fio_str_s_conflict *s,size_t size)

{
  byte bVar1;
  char *pcVar2;
  uint64_t uVar3;
  ulong uVar4;
  size_t sVar5;
  fio_str_info_s local_30;
  
  if (s == (fio_str_s_conflict *)0x0) {
LAB_00143af1:
    __return_storage_ptr__->capa = 0;
    __return_storage_ptr__->len = 0;
    __return_storage_ptr__->data = (char *)0x0;
    return __return_storage_ptr__;
  }
  if (s->frozen != '\0') {
    if (s != (fio_str_s_conflict *)0x0) {
      bVar1 = s->small;
      if ((bVar1 == 0) && (pcVar2 = s->data, pcVar2 != (char *)0x0)) {
        if (s->frozen == '\0') {
          uVar3 = s->capa;
        }
        else {
          uVar3 = 0;
        }
        __return_storage_ptr__->capa = uVar3;
        __return_storage_ptr__->len = s->len;
        __return_storage_ptr__->data = pcVar2;
        return __return_storage_ptr__;
      }
      sVar5 = 0x2d;
      if (s->frozen != '\0') {
        sVar5 = 0;
      }
      __return_storage_ptr__->capa = sVar5;
      __return_storage_ptr__->len = (ulong)(bVar1 >> 1);
code_r0x00143aeb:
      __return_storage_ptr__->data = (char *)s->reserved;
      return __return_storage_ptr__;
    }
    goto LAB_00143af1;
  }
  if ((s->small == '\0') && (s->data != (char *)0x0)) {
    uVar4 = s->capa;
    if (size < uVar4) goto LAB_00143b80;
    if (s->dealloc == (_func_void_void_ptr *)0x0) {
      uVar4 = s->len;
    }
    s->len = uVar4;
  }
  else {
    if (size < 0x2e) {
      s->small = (char)size * '\x02' + '\x01';
      s->reserved[size] = '\0';
      __return_storage_ptr__->capa = 0x2d;
      __return_storage_ptr__->len = size;
      goto code_r0x00143aeb;
    }
    s->small = '[';
  }
  fio_str_capa_assert(&local_30,s,size);
LAB_00143b80:
  s->len = size;
  s->data[size] = '\0';
  __return_storage_ptr__->capa = s->capa;
  __return_storage_ptr__->len = size;
  __return_storage_ptr__->data = s->data;
  return __return_storage_ptr__;
}

Assistant:

inline FIO_FUNC fio_str_info_s fio_str_resize(fio_str_s *s, size_t size) {
  if (!s || s->frozen) {
    return fio_str_info(s);
  }
  if (s->small || !s->data) {
    if (size < FIO_STR_SMALL_CAPA) {
      s->small = (uint8_t)(((size << 1) | 1) & 0xFF);
      FIO_STR_SMALL_DATA(s)[size] = 0;
      return (fio_str_info_s){.capa = (FIO_STR_SMALL_CAPA - 1),
                              .len = size,
                              .data = FIO_STR_SMALL_DATA(s)};
    }
    s->small = (uint8_t)((((FIO_STR_SMALL_CAPA - 1) << 1) | 1) & 0xFF);
    fio_str_capa_assert(s, size);
    goto big;
  }
  if (size >= s->capa) {
    s->len = fio_ct_if2((uintptr_t)s->dealloc, s->capa, s->len);
    fio_str_capa_assert(s, size);
  }

big:
  s->len = size;
  s->data[size] = 0;
  return (fio_str_info_s){.capa = s->capa, .len = size, .data = s->data};
}